

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Strings.cc
# Opt level: O2

char * phosg::name_for_enum<phosg::LogLevel>(LogLevel level)

{
  invalid_argument *this;
  
  if ((uint)(level + INFO) < 6) {
    return &DAT_00116968 + *(int *)(&DAT_00116968 + (ulong)(uint)(level + INFO) * 4);
  }
  this = (invalid_argument *)__cxa_allocate_exception(0x10);
  ::std::invalid_argument::invalid_argument(this,"invalid LogLevel value");
  __cxa_throw(this,&::std::invalid_argument::typeinfo,::std::invalid_argument::~invalid_argument);
}

Assistant:

const char* name_for_enum<LogLevel>(LogLevel level) {
  switch (level) {
    case LogLevel::USE_DEFAULT:
      return "USE_DEFAULT";
    case LogLevel::DEBUG:
      return "DEBUG";
    case LogLevel::INFO:
      return "INFO";
    case LogLevel::WARNING:
      return "WARNING";
    case LogLevel::ERROR:
      return "ERROR";
    case LogLevel::DISABLED:
      return "DISABLED";
    default:
      throw invalid_argument("invalid LogLevel value");
  }
}